

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O3

void dopost(char *s)

{
  int iVar1;
  
  if ((pd_maininstance.pd_stuff)->st_printhook != (t_printhook)0x0) {
    (*(pd_maininstance.pd_stuff)->st_printhook)(s);
    return;
  }
  if (sys_printtostderr == 0) {
    iVar1 = sys_havegui();
    if (iVar1 != 0) {
      pdgui_vmess("::pdwindow::post","s",s);
      return;
    }
  }
  fputs(s,_stderr);
  return;
}

Assistant:

static void dopost(const char *s)
{
    if (STUFF->st_printhook)
        (*STUFF->st_printhook)(s);
    else if (sys_printtostderr || !sys_havegui())
    {
#ifdef _WIN32
    #ifdef _MSC_VER
        fwprintf(stderr, L"%S", s);
    #else
        fwprintf(stderr, L"%s", s);
    #endif
        fflush(stderr);
#else
        fprintf(stderr, "%s", s);
#endif
    }
    else
    {
        pdgui_vmess("::pdwindow::post", "s", s);
    }
}